

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O2

void __thiscall
calc_server::calc_state_machine::create_snapshot_internal
          (calc_state_machine *this,ptr<snapshot> *ss)

{
  size_t sVar1;
  __shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  int ii;
  int iVar2;
  ptr<snapshot_ctx> ctx;
  __shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2> local_40;
  ulong local_30;
  
  std::mutex::lock(&this->snapshots_lock_);
  std::
  make_shared<calc_server::calc_state_machine::snapshot_ctx,std::shared_ptr<nuraft::snapshot>&,std::atomic<long>&>
            ((shared_ptr<nuraft::snapshot> *)&local_40,(atomic<long> *)ss);
  local_30 = ((ss->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             last_log_idx_;
  this_00 = &std::
             map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
             ::operator[](&this->snapshots_,&local_30)->
             super___shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::__shared_ptr<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2>::
  operator=(this_00,&local_40);
  sVar1 = (this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __position._M_node = (this->snapshots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar2 = 0;
  while ((iVar2 < (int)sVar1 + -3 &&
         ((_Rb_tree_header *)__position._M_node !=
          &(this->snapshots_)._M_t._M_impl.super__Rb_tree_header))) {
    __position = std::
                 _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>>>
                 ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>>>>
                                     *)&this->snapshots_,__position);
    iVar2 = iVar2 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->snapshots_lock_);
  return;
}

Assistant:

void create_snapshot_internal(ptr<snapshot> ss) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);

        // Put into snapshot map.
        ptr<snapshot_ctx> ctx = cs_new<snapshot_ctx>(ss, cur_value_);
        snapshots_[ss->get_last_log_idx()] = ctx;

        // Maintain last 3 snapshots only.
        const int MAX_SNAPSHOTS = 3;
        int num = snapshots_.size();
        auto entry = snapshots_.begin();
        for (int ii = 0; ii < num - MAX_SNAPSHOTS; ++ii) {
            if (entry == snapshots_.end()) break;
            entry = snapshots_.erase(entry);
        }
    }